

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev-primality-test.cpp
# Opt level: O0

void BM_chebyshev(State *state)

{
  int iVar1;
  ostream *poVar2;
  const_reference pvVar3;
  State *in_RDI;
  bool bVar4;
  bool sanity_test;
  bool prime;
  Value _;
  StateIterator __end1;
  StateIterator __begin1;
  State *__range1;
  uint64_t in_stack_00000218;
  mapped_type *in_stack_fffffffffffffe78;
  long local_168;
  key_type *in_stack_fffffffffffffea8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter>_>_>
  *in_stack_fffffffffffffeb0;
  allocator local_141;
  string local_140 [32];
  double local_120;
  undefined8 local_118;
  byte local_10c;
  byte local_10b;
  undefined8 local_108;
  undefined8 local_100;
  long local_f8;
  State *local_f0;
  State *local_e0;
  undefined1 local_d0 [24];
  undefined1 local_b8 [16];
  undefined8 *local_a8;
  long *local_a0;
  bool local_91;
  long *local_90;
  undefined8 local_88;
  State *local_80;
  undefined8 local_78;
  State *local_70;
  undefined8 local_68;
  State *local_60;
  undefined8 local_58;
  State *local_50;
  undefined4 local_48;
  undefined4 local_44;
  double local_40;
  double *local_38;
  long *local_30;
  undefined1 *local_10;
  undefined1 *local_8;
  
  local_10 = local_d0;
  if (((byte)in_RDI[0x1a] & 1) == 0) {
    local_168 = *(long *)(in_RDI + 0x10);
  }
  else {
    local_168 = 0;
  }
  local_f8 = local_168;
  local_f0 = in_RDI;
  local_e0 = in_RDI;
  benchmark::State::StartKeepRunning(in_RDI);
  local_8 = local_b8;
  local_108 = 0;
  local_100 = 0;
  while( true ) {
    local_a0 = &local_f8;
    local_a8 = &local_108;
    bVar4 = local_f8 == 0;
    if (bVar4) {
      benchmark::State::FinishKeepRunning(local_f0);
    }
    local_91 = !bVar4;
    if (!local_91) goto LAB_0011d56a;
    local_90 = &local_f8;
    local_50 = local_e0;
    local_58 = 0;
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)(local_e0 + 0x20),0);
    local_10b = isprime_chebyshev(in_stack_00000218);
    local_60 = local_e0;
    local_68 = 0;
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)(local_e0 + 0x20),0);
    iVar1 = gaIIsPrime((uint64_t)in_stack_fffffffffffffe78);
    local_10c = iVar1 != 0;
    local_120 = (double)(local_10b & 1);
    local_38 = &local_120;
    local_44 = 0;
    local_48 = 1000;
    local_118._0_4_ = 0;
    local_118._4_4_ = 1000;
    local_40 = local_120;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,"IS PRIME",&local_141);
    in_stack_fffffffffffffe78 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_benchmark::Counter>_>_>
         ::operator[](in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    in_stack_fffffffffffffe78->value = local_120;
    in_stack_fffffffffffffe78->flags = (undefined4)local_118;
    in_stack_fffffffffffffe78->oneK = local_118._4_4_;
    std::__cxx11::string::~string(local_140);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    if ((local_10c & 1) != (local_10b & 1)) break;
    local_30 = &local_f8;
    local_f8 = local_f8 + -1;
  }
  poVar2 = std::operator<<((ostream *)std::cout,"Sanity check failed for ");
  local_70 = local_e0;
  local_78 = 0;
  pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                     ((vector<long,_std::allocator<long>_> *)(local_e0 + 0x20),0);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,*pvVar3);
  std::operator<<(poVar2,"\n");
LAB_0011d56a:
  local_80 = local_e0;
  local_88 = 0;
  pvVar3 = std::vector<long,_std::allocator<long>_>::operator[]
                     ((vector<long,_std::allocator<long>_> *)(local_e0 + 0x20),0);
  *(value_type *)(local_e0 + 0x38) = *pvVar3;
  return;
}

Assistant:

static void BM_chebyshev(benchmark::State& state) {

  for (auto _ : state) {
    bool prime = isprime_chebyshev(state.range(0));
    bool sanity_test = gaIIsPrime(state.range(0));
    state.counters["IS PRIME"] = prime; 
    if (sanity_test != prime) {
        std::cout << "Sanity check failed for " << state.range(0) << "\n";
        break;
    }
  }
  state.SetComplexityN(state.range(0));
}